

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall google::protobuf::Symbol::GetFile(Symbol *this)

{
  Type TVar1;
  FieldDescriptor *this_00;
  OneofDescriptor *this_01;
  Descriptor *pDVar2;
  EnumValueDescriptor *this_02;
  EnumDescriptor *pEVar3;
  MethodDescriptor *this_03;
  ServiceDescriptor *pSVar4;
  Subpackage *pSVar5;
  Symbol *this_local;
  
  TVar1 = type(this);
  switch(TVar1) {
  case MESSAGE:
    pDVar2 = descriptor(this);
    this_local = (Symbol *)Descriptor::file(pDVar2);
    break;
  case FIELD:
    this_00 = field_descriptor(this);
    this_local = (Symbol *)FieldDescriptor::file(this_00);
    break;
  case ONEOF:
    this_01 = oneof_descriptor(this);
    pDVar2 = OneofDescriptor::containing_type(this_01);
    this_local = (Symbol *)Descriptor::file(pDVar2);
    break;
  case ENUM:
    pEVar3 = enum_descriptor(this);
    this_local = (Symbol *)EnumDescriptor::file(pEVar3);
    break;
  case ENUM_VALUE:
    this_02 = enum_value_descriptor(this);
    pEVar3 = EnumValueDescriptor::type(this_02);
    this_local = (Symbol *)EnumDescriptor::file(pEVar3);
    break;
  default:
    this_local = (Symbol *)0x0;
    break;
  case SERVICE:
    pSVar4 = service_descriptor(this);
    this_local = (Symbol *)ServiceDescriptor::file(pSVar4);
    break;
  case METHOD:
    this_03 = method_descriptor(this);
    pSVar4 = MethodDescriptor::service(this_03);
    this_local = (Symbol *)ServiceDescriptor::file(pSVar4);
    break;
  case FULL_PACKAGE:
    this_local = (Symbol *)file_descriptor(this);
    break;
  case SUB_PACKAGE:
    pSVar5 = sub_package_file_descriptor(this);
    this_local = (Symbol *)pSVar5->file;
  }
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* GetFile() const {
    switch (type()) {
      case MESSAGE:
        return descriptor()->file();
      case FIELD:
        return field_descriptor()->file();
      case ONEOF:
        return oneof_descriptor()->containing_type()->file();
      case ENUM:
        return enum_descriptor()->file();
      case ENUM_VALUE:
        return enum_value_descriptor()->type()->file();
      case SERVICE:
        return service_descriptor()->file();
      case METHOD:
        return method_descriptor()->service()->file();
      case FULL_PACKAGE:
        return file_descriptor();
      case SUB_PACKAGE:
        return sub_package_file_descriptor()->file;
      default:
        return nullptr;
    }
  }